

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_crop.c
# Opt level: O0

gdImagePtr gdImageCropThreshold(gdImagePtr im,uint color,float threshold)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 local_44 [8];
  gdRect crop;
  int match;
  int y;
  int x;
  int height;
  int width;
  float threshold_local;
  uint color_local;
  gdImagePtr im_local;
  
  iVar3 = im->sx;
  iVar2 = im->sy;
  local_44._0_4_ = 0;
  local_44._4_4_ = 0;
  crop.x = 0;
  crop.y = 0;
  if (threshold <= 100.0) {
    crop.width = 1;
    for (crop.height = 0; crop.width != 0 && crop.height < iVar2; crop.height = crop.height + 1) {
      match = 0;
      while (crop.width != 0 && match < iVar3) {
        iVar1 = gdImageGetPixel(im,match,crop.height);
        iVar1 = gdColorMatch(im,color,iVar1,threshold);
        match = match + 1;
        crop.width = (int)(0 < iVar1);
      }
    }
    if (crop.height == iVar2 + -1) {
      im_local = (gdImagePtr)0x0;
    }
    else {
      local_44._4_4_ = crop.height + -1;
      crop.width = 1;
      crop.height = iVar2;
      while (crop.height = crop.height + -1, crop.width != 0 && -1 < crop.height) {
        match = 0;
        while (crop.width != 0 && match < iVar3) {
          iVar1 = gdImageGetPixel(im,match,crop.height);
          iVar1 = gdColorMatch(im,color,iVar1,threshold);
          match = match + 1;
          crop.width = (int)(0 < iVar1);
        }
      }
      if (crop.height == 0) {
        crop.y = (iVar2 - local_44._4_4_) + 1;
      }
      else {
        crop.y = (crop.height - local_44._4_4_) + 2;
      }
      crop.width = 1;
      for (match = 0; crop.width != 0 && match < iVar3; match = match + 1) {
        crop.height = 0;
        while (crop.width != 0 && crop.height < local_44._4_4_ + crop.y + -1) {
          iVar2 = gdImageGetPixel(im,match,crop.height);
          iVar2 = gdColorMatch(im,color,iVar2,threshold);
          crop.height = crop.height + 1;
          crop.width = (int)(0 < iVar2);
        }
      }
      local_44._0_4_ = match + -1;
      crop.width = 1;
      match = iVar3;
      while (match = match + -1, crop.width != 0 && -1 < match) {
        crop.height = 0;
        while (crop.width != 0 && crop.height < local_44._4_4_ + crop.y + -1) {
          iVar3 = gdImageGetPixel(im,match,crop.height);
          iVar3 = gdColorMatch(im,color,iVar3,threshold);
          crop.height = crop.height + 1;
          crop.width = (int)(0 < iVar3);
        }
      }
      crop.x = (match - local_44._0_4_) + 2;
      im_local = gdImageCrop(im,(gdRect *)local_44);
    }
  }
  else {
    im_local = (gdImagePtr)0x0;
  }
  return im_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCropThreshold(gdImagePtr im, const unsigned int color, const float threshold)
{
	const int width = gdImageSX(im);
	const int height = gdImageSY(im);

	int x,y;
	int match;
	gdRect crop;

	crop.x = 0;
	crop.y = 0;
	crop.width = 0;
	crop.height = 0;

	/* Pierre: crop everything sounds bad */
	if (threshold > 100.0) {
		return NULL;
	}

	/* TODO: Add gdImageGetRowPtr and works with ptr at the row level
	 * for the true color and palette images
	 * new formats will simply work with ptr
	 */
	match = 1;
	for (y = 0; match && y < height; y++) {
		for (x = 0; match && x < width; x++) {
			match = (gdColorMatch(im, color, gdImageGetPixel(im, x,y), threshold)) > 0;
		}
	}

	/* Pierre
	 * Nothing to do > bye
	 * Duplicate the image?
	 */
	if (y == height - 1) {
		return NULL;
	}

	crop.y = y -1;
	match = 1;
	for (y = height - 1; match && y >= 0; y--) {
		for (x = 0; match && x < width; x++) {
			match = (gdColorMatch(im, color, gdImageGetPixel(im, x, y), threshold)) > 0;
		}
	}

	if (y == 0) {
		crop.height = height - crop.y + 1;
	} else {
		crop.height = y - crop.y + 2;
	}

	match = 1;
	for (x = 0; match && x < width; x++) {
		for (y = 0; match && y < crop.y + crop.height - 1; y++) {
			match = (gdColorMatch(im, color, gdImageGetPixel(im, x,y), threshold)) > 0;
		}
	}
	crop.x = x - 1;

	match = 1;
	for (x = width - 1; match && x >= 0; x--) {
		for (y = 0; match &&  y < crop.y + crop.height - 1; y++) {
			match = (gdColorMatch(im, color, gdImageGetPixel(im, x,y), threshold)) > 0;
		}
	}
	crop.width = x - crop.x + 2;

	return gdImageCrop(im, &crop);
}